

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauTree.c
# Opt level: O0

void Dss_NtkTransform(Dss_Ntk_t *p,int *pPermDsd)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  uint uVar2;
  int iVar3;
  Dss_Obj_t *pDVar4;
  bool bVar5;
  uint local_94;
  int local_90;
  int nPerms;
  int k;
  int i;
  Dss_Obj_t *pChild;
  Dss_Obj_t *pObj;
  Dss_Obj_t *pChildren [12];
  int *pPermDsd_local;
  Dss_Ntk_t *p_local;
  
  pChildren[0xb] = (Dss_Obj_t *)pPermDsd;
  pDVar4 = Dss_Regular(p->pRoot);
  if ((*(uint *)&pDVar4->field_0x4 & 7) != 1) {
    for (nPerms = 0; iVar3 = nPerms, iVar1 = Vec_PtrSize(p->vObjs), iVar3 < iVar1;
        nPerms = nPerms + 1) {
      pChild = (Dss_Obj_t *)Vec_PtrEntry(p->vObjs,nPerms);
      if (((((*(uint *)&pChild->field_0x4 & 7) != 1) && ((*(uint *)&pChild->field_0x4 & 7) != 2)) &&
          ((*(uint *)&pChild->field_0x4 & 7) != 5)) && ((*(uint *)&pChild->field_0x4 & 7) != 6)) {
        local_90 = 0;
        while( true ) {
          iVar3 = local_90;
          iVar1 = Dss_ObjFaninNum(pChild);
          bVar5 = false;
          if (iVar3 < iVar1) {
            _k = Dss_ObjChild(p->vObjs,pChild,local_90);
            bVar5 = _k != (Dss_Obj_t *)0x0;
          }
          if (!bVar5) break;
          pChildren[(long)local_90 + -1] = _k;
          local_90 = local_90 + 1;
        }
        p_00 = p->vObjs;
        iVar3 = Dss_ObjFaninNum(pChild);
        Dss_ObjSort(p_00,&pObj,iVar3,(int *)0x0);
        for (local_90 = 0; iVar3 = local_90, iVar1 = Dss_ObjFaninNum(pChild), iVar3 < iVar1;
            local_90 = local_90 + 1) {
          uVar2 = Dss_Obj2Lit(pChildren[(long)local_90 + -1]);
          (&pChild[1].Id)[local_90] = uVar2;
        }
      }
    }
    local_94 = 0;
    iVar3 = Dss_NtkCollectPerm_rec(p,p->pRoot,(int *)pChildren[0xb],(int *)&local_94);
    if (iVar3 != 0) {
      pDVar4 = Dss_Regular(p->pRoot);
      p->pRoot = pDVar4;
    }
    uVar2 = local_94;
    pDVar4 = Dss_Regular(p->pRoot);
    if (uVar2 != (*(uint *)&pDVar4->field_0x4 >> 3 & 0xff)) {
      __assert_fail("nPerms == (int)Dss_Regular(p->pRoot)->nSupp",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauTree.c"
                    ,0x2e9,"void Dss_NtkTransform(Dss_Ntk_t *, int *)");
    }
  }
  return;
}

Assistant:

void Dss_NtkTransform( Dss_Ntk_t * p, int * pPermDsd )
{
    Dss_Obj_t * pChildren[DAU_MAX_VAR];
    Dss_Obj_t * pObj, * pChild;
    int i, k, nPerms;
    if ( Dss_Regular(p->pRoot)->Type == DAU_DSD_CONST0 )
        return;
    Dss_VecForEachNode( p->vObjs, pObj, i )
    {
        if ( pObj->Type == DAU_DSD_MUX || pObj->Type == DAU_DSD_PRIME )
            continue;
        Dss_ObjForEachChild( p->vObjs, pObj, pChild, k )
            pChildren[k] = pChild;
        Dss_ObjSort( p->vObjs, pChildren, Dss_ObjFaninNum(pObj), NULL );
        for ( k = 0; k < Dss_ObjFaninNum(pObj); k++ )
            pObj->pFans[k] = Dss_Obj2Lit( pChildren[k] );
    }
    nPerms = 0;
    if ( Dss_NtkCollectPerm_rec( p, p->pRoot, pPermDsd, &nPerms ) )
        p->pRoot = Dss_Regular(p->pRoot);
    assert( nPerms == (int)Dss_Regular(p->pRoot)->nSupp );
}